

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O3

void __thiscall
TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_>::CopyFrom
          (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_> *this,
          TPZMatrix<float> *mat)

{
  _func_int **pp_Var1;
  STensorProductMTData *pSVar2;
  int64_t iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  TPZMatrix<float> *cp;
  
  if (mat != (TPZMatrix<float> *)0x0) {
    cp = (TPZMatrix<float> *)
         __dynamic_cast(mat,&TPZMatrix<float>::typeinfo,
                        &TPZFrontMatrix<float,TPZFileEqnStorage<float>,TPZFrontSym<float>>::typeinfo
                        ,0);
    if (cp != (TPZMatrix<float> *)0x0) {
      TPZMatrix<float>::operator=((TPZMatrix<float> *)this,cp);
      (this->fStorage).fNumHeaders = (int)cp[1].super_TPZBaseMatrix.fRow;
      TPZManVector<long,_10>::operator=
                (&(this->fStorage).fBlockPos.super_TPZManVector<long,_10>,
                 (TPZManVector<long,_10> *)&cp[1].super_TPZBaseMatrix.fCol);
      std::__cxx11::string::_M_assign((string *)&(this->fStorage).fFileName);
      (this->fStorage).fNumBlocks = (int)cp[6].super_TPZBaseMatrix.fCol;
      uVar4 = *(undefined4 *)&cp[6].super_TPZBaseMatrix.fRow;
      uVar5 = *(undefined4 *)((long)&cp[6].super_TPZBaseMatrix.fRow + 4);
      (this->fStorage).fIOStream =
           (FILE *)cp[6].super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
      (this->fStorage).fCurrentBlock = uVar4;
      (this->fStorage).fCurBlockPosition = uVar5;
      *(_func_int ***)&(this->fFront).super_TPZFront<float>.fWork =
           cp[7].super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
      TPZManVector<long,_10>::operator=
                (&(this->fFront).super_TPZFront<float>.fGlobal,
                 (TPZManVector<long,_10> *)&cp[7].super_TPZBaseMatrix.fRow);
      TPZVec<long>::operator=
                (&(this->fFront).super_TPZFront<float>.fLocal,
                 (TPZVec<long> *)&cp[10].super_TPZBaseMatrix.fDecomposed);
      pp_Var1 = cp[0xc].super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
      (this->fFront).super_TPZFront<float>.fFront =
           *(int64_t *)&cp[0xb].super_TPZBaseMatrix.fDecomposed;
      (this->fFront).super_TPZFront<float>.fNextRigidBodyMode = (int64_t)pp_Var1;
      TPZManVector<int,_10>::operator=
                (&(this->fFront).super_TPZFront<float>.fFree.super_TPZManVector<int,_10>,
                 (TPZManVector<int,_10> *)&cp[0xc].super_TPZBaseMatrix.fRow);
      TPZVec<float>::operator=
                (&(this->fFront).super_TPZFront<float>.fData,
                 (TPZVec<float> *)&cp[0xe].super_TPZBaseMatrix.fCol);
      uVar4 = *(undefined4 *)((long)&cp[0xf].super_TPZBaseMatrix.fCol + 4);
      pSVar2 = *(STensorProductMTData **)&cp[0xf].super_TPZBaseMatrix.fDecomposed;
      (this->fFront).super_TPZFront<float>.fExpandRatio =
           *(undefined4 *)&cp[0xf].super_TPZBaseMatrix.fCol;
      (this->fFront).super_TPZFront<float>.fDecomposeType = uVar4;
      (this->fFront).super_TPZFront<float>.fProductMTData = pSVar2;
      iVar3 = cp[0x10].super_TPZBaseMatrix.fRow;
      this->fNumEq = (int64_t)cp[0x10].super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
      this->fLastDecomposed = iVar3;
      TPZVec<int>::operator=
                (&this->fNumElConnected,(TPZVec<int> *)&cp[0x10].super_TPZBaseMatrix.fCol);
      TPZVec<int>::operator=
                (&this->fNumElConnectedBackup,(TPZVec<int> *)&cp[0x11].super_TPZBaseMatrix.fCol);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZFrontMatrix<float, TPZFileEqnStorage<float>, TPZFrontSym<float>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = float, store = TPZFileEqnStorage<float>, front = TPZFrontSym<float>]"
             ,0xc0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFrontMatrix.h"
             ,0xb6);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZFrontMatrix<TVar,store,front> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }